

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddCircle
          (ImDrawList *this,ImVec2 *centre,float radius,ImU32 col,int num_segments,float thickness)

{
  int in_ECX;
  uint in_EDX;
  undefined8 in_RDI;
  float col_00;
  undefined4 in_XMM1_Da;
  float unaff_retaddr;
  float unaff_retaddr_00;
  ImVec2 *in_stack_00000008;
  ImDrawList *in_stack_00000010;
  float a_max;
  undefined1 in_stack_ffffffffffffffdb;
  
  if (((in_EDX & 0xff000000) != 0) && (2 < in_ECX)) {
    col_00 = (((float)in_ECX - 1.0) * 6.2831855) / (float)in_ECX;
    PathArcTo(in_stack_00000010,in_stack_00000008,unaff_retaddr_00,unaff_retaddr,
              (float)((ulong)in_RDI >> 0x20),(int)in_RDI);
    PathStroke((ImDrawList *)CONCAT44(in_ECX,in_XMM1_Da),(ImU32)col_00,
               (bool)in_stack_ffffffffffffffdb,(float)((ulong)in_RDI >> 0x20));
  }
  return;
}

Assistant:

void ImDrawList::AddCircle(const ImVec2& centre, float radius, ImU32 col, int num_segments, float thickness)
{
    if ((col & IM_COL32_A_MASK) == 0 || num_segments <= 2)
        return;

    // Because we are filling a closed shape we remove 1 from the count of segments/points
    const float a_max = IM_PI*2.0f * ((float)num_segments - 1.0f) / (float)num_segments;
    PathArcTo(centre, radius-0.5f, 0.0f, a_max, num_segments - 1);
    PathStroke(col, true, thickness);
}